

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::block<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          bool folded)

{
  ParseInput *this;
  undefined1 auVar1 [16];
  bool bVar2;
  Index pos;
  undefined7 in_register_00000011;
  TypeUse *pTVar3;
  string *this_00;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  Signature SVar4;
  undefined1 local_198 [8];
  optional<wasm::Name> label;
  string local_160;
  string local_140;
  TypeUse local_120;
  undefined1 local_100 [8];
  Result<wasm::HeapType> type;
  undefined1 local_b0 [8];
  Result<wasm::WATParser::Ok> insts;
  Result<wasm::HeapType> _val_2;
  undefined1 local_58 [8];
  Result<wasm::HeapType> type_1;
  
  this = &ctx->in;
  ParseInput::getPos(this);
  if ((int)CONCAT71(in_register_00000011,folded) == 0) {
    expected_00._M_str = "block";
    expected_00._M_len = 5;
    bVar2 = ParseInput::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "block";
    expected._M_len = 5;
    bVar2 = ParseInput::takeSExprStart(this,expected);
  }
  if (bVar2 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  ParseInput::takeID((optional<wasm::Name> *)local_198,this);
  pos = ParseInput::getPos(this);
  results<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_b0,ctx);
  if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ == '\x01')
  {
LAB_00a9358f:
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_b0);
    Lexer::setIndex(&this->lexer,(ulong)pos);
    typeuse<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::(anonymous_namespace)::TypeUse> *)local_b0,ctx);
    Result<wasm::WATParser::(anonymous_namespace)::TypeUse>::Result
              ((Result<wasm::WATParser::(anonymous_namespace)::TypeUse> *)local_58,
               (Result<wasm::WATParser::(anonymous_namespace)::TypeUse> *)local_b0);
    if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),
                 (string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)local_100,
                 (__index_type *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
                           *)local_58);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
                           *)local_58);
      pTVar3 = (TypeUse *)0x0;
      if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
          '\0') {
        pTVar3 = (TypeUse *)local_b0;
      }
      TypeUse::TypeUse(&local_120,pTVar3);
      bVar2 = HeapType::isSignature(&local_120.type);
      if (!bVar2) {
        __assert_fail("use.type.isSignature()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                      ,0x4c1,
                      "Result<HeapType> wasm::WATParser::(anonymous namespace)::ParseModuleTypesCtx::getBlockTypeFromTypeUse(Index, TypeUse)"
                     );
      }
      SVar4 = HeapType::getSignature(&local_120.type);
      if (SVar4.params.id.id == 0) {
        local_58 = (undefined1  [8])local_120.type.id;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                   "block parameters not yet supported",
                   (allocator<char> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x27));
        ParseInput::err((Err *)((long)&insts.val.
                                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                               + 0x20),this,pos,
                        (string *)
                        ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20)
                       );
        std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)local_58,
                   (__index_type *)
                   ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
      }
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                (&local_120.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                      ((long)&insts.val.
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                      0x20),(_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_58
                     );
      if (_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01')
      {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                   (string *)
                   ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)local_100,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                          ((long)&insts.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                          + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                          ((long)&insts.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                          + 0x20));
        local_100 = local_58;
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_58);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
                       *)local_b0);
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_58,
                      (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_b0);
    if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),
                 (string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)local_100,
                 (__index_type *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_58);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_58);
      pTVar3 = (TypeUse *)0x0;
      if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
          '\0') {
        pTVar3 = (TypeUse *)local_b0;
      }
      if ((long)(pTVar3->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start -
          *(long *)&((_Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                      *)&pTVar3->type)->_M_u != 8) goto LAB_00a9358f;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)pTVar3);
      if ((long)type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
                _M_storage.id - (long)local_58 != 8) {
        __assert_fail("results.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                      ,0x294,
                      "HeapType wasm::WATParser::(anonymous namespace)::TypeParserCtx<wasm::WATParser::(anonymous namespace)::ParseModuleTypesCtx>::getBlockTypeFromResult(const std::vector<Type>) [Ctx = wasm::WATParser::(anonymous namespace)::ParseModuleTypesCtx]"
                     );
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)local_58;
      HeapType::HeapType((HeapType *)
                         ((long)&insts.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x20),(Signature)(auVar1 << 0x40));
      local_100 = (undefined1  [8])
                  insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_b0);
  }
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_b0,
                  (_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_100);
  if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ == '\x01')
  {
    std::__cxx11::string::string((string *)local_58,(string *)local_b0);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
    _Variant_storage<2ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_b0);
    goto LAB_00a93a16;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_b0);
  instrs<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::WATParser::Ok> *)local_b0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58,
                  (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_b0);
  if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),
               (string *)local_58);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
    _Variant_storage<2ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                *)__return_storage_ptr__,
               (__index_type *)
               ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58
                     );
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58
                     );
    if (folded) {
      bVar2 = ParseInput::takeRParen(this);
      if (bVar2) {
LAB_00a939b9:
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\0';
        goto LAB_00a93a0a;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,
                 "expected \')\' at end of block",
                 (allocator<char> *)
                 ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      ParseInput::err((Err *)local_58,this,
                      (string *)
                      &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
      _Variant_storage<2ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                  *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      this_00 = (string *)
                &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_engaged;
    }
    else {
      expected_01._M_str = "end";
      expected_01._M_len = 3;
      bVar2 = ParseInput::takeKeyword(this,expected_01);
      if (bVar2) {
        ParseInput::takeID((optional<wasm::Name> *)
                           ((long)&insts.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           + 0x20),this);
        if ((_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ != '\x01'
            ) || ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
                  (_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
                   _M_storage.id ==
                   (_Uninitialized<wasm::HeapType,_true>)
                   label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len)))) goto LAB_00a939b9;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"end label does not match block label",
                   (allocator<char> *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
        ParseInput::err((Err *)local_58,this,&local_140);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,local_58);
        std::__cxx11::string::~string((string *)local_58);
        this_00 = &local_140;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"expected \'end\' at end of block",
                   (allocator<char> *)
                   ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        ParseInput::err((Err *)local_58,this,&local_160);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,local_58);
        std::__cxx11::string::~string((string *)local_58);
        this_00 = &local_160;
      }
    }
    std::__cxx11::string::~string((string *)this_00);
  }
LAB_00a93a0a:
  std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_b0);
LAB_00a93a16:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_100);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::InstrT> block(Ctx& ctx, bool folded) {
  auto pos = ctx.in.getPos();

  if (folded) {
    if (!ctx.in.takeSExprStart("block"sv)) {
      return {};
    }
  } else {
    if (!ctx.in.takeKeyword("block"sv)) {
      return {};
    }
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto insts = instrs(ctx);
  CHECK_ERR(insts);

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of block");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of block");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match block label");
    }
  }

  return ctx.makeBlock(pos, label, *type, std::move(*insts));
}